

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O3

void ApprovalTests::
     TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
     verifyExistingFile(string *filePath,Options *options)

{
  pointer pcVar1;
  Reporter *siglen;
  uchar *in_RCX;
  size_t in_R8;
  ExistingFile writer;
  string local_a0;
  ExistingFileNamer local_80;
  ExistingFile local_50;
  
  pcVar1 = (filePath->_M_dataplus)._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + filePath->_M_string_length);
  ExistingFile::ExistingFile(&local_50,&local_a0,options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  ExistingFile::getNamer(&local_80,&local_50);
  siglen = ApprovalTests::Options::getReporter(options);
  FileApprover::verify((EVP_PKEY_CTX *)&local_80,(uchar *)&local_50,(size_t)siglen,in_RCX,in_R8);
  local_80.super_ApprovalNamer._vptr_ApprovalNamer = (_func_int **)&PTR__ExistingFileNamer_001d2628;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.filePath._M_dataplus._M_p != &local_80.filePath.field_2) {
    operator_delete(local_80.filePath._M_dataplus._M_p,
                    local_80.filePath.field_2._M_allocated_capacity + 1);
  }
  local_50.super_ApprovalWriter._vptr_ApprovalWriter = (_func_int **)&PTR__ExistingFile_001d3b40;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.filePath._M_dataplus._M_p != &local_50.filePath.field_2) {
    operator_delete(local_50.filePath._M_dataplus._M_p,
                    local_50.filePath.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void verifyExistingFile(const std::string& filePath,
                                       const Options& options = Options())
        {
            ExistingFile writer(filePath, options);
            FileApprover::verify(writer.getNamer(), writer, options.getReporter());
        }